

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Reader.cpp
# Opt level: O0

void __thiscall adios2::core::engine::BP5Reader::NotifyEngineNoVarsQuery(BP5Reader *this)

{
  long in_RDI;
  allocator local_b1;
  string local_b0 [36];
  int in_stack_ffffffffffffff74;
  string *in_stack_ffffffffffffff78;
  string *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  allocator local_61;
  string local_60 [55];
  allocator local_29;
  string local_28 [40];
  
  if ((*(byte *)(in_RDI + 0x84) & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"Engine",&local_29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"BP5Reader",&local_61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xffffffffffffff78,"NotifyEngineNoVarsQuery",
               (allocator *)&stack0xffffffffffffff77);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_b0,
               "You\'ve called InquireVariable() when the IO is empty and outside a BeginStep/EndStep pair.  If this is code that is newly transititioning to the BP5 file engine, you may be relying upon deprecated behaviour.  If you intend to use ADIOS using the Begin/EndStep interface, move all InquireVariable calls inside the BeginStep/EndStep pair.  If intending to use random-access file mode, change your Open() mode parameter to Mode::ReadRandomAccess."
               ,&local_b1);
    helper::Throw<std::logic_error>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
    std::__cxx11::string::~string(local_60);
    std::allocator<char>::~allocator((allocator<char> *)&local_61);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return;
}

Assistant:

void BP5Reader::NotifyEngineNoVarsQuery()
{
    if (!m_BetweenStepPairs)
    {
        helper::Throw<std::logic_error>(
            "Engine", "BP5Reader", "NotifyEngineNoVarsQuery",
            "You've called InquireVariable() when the IO is empty and "
            "outside a BeginStep/EndStep pair.  If this is code that is "
            "newly "
            "transititioning to the BP5 file engine, you may be relying "
            "upon "
            "deprecated behaviour.  If you intend to use ADIOS using the "
            "Begin/EndStep interface, move all InquireVariable calls "
            "inside "
            "the BeginStep/EndStep pair.  If intending to use "
            "random-access "
            "file mode, change your Open() mode parameter to "
            "Mode::ReadRandomAccess.");
    }
}